

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCacheCoverage.cxx
# Opt level: O1

bool __thiscall cmParseCacheCoverage::ReadCMCovFile(cmParseCacheCoverage *this,char *file)

{
  cmCTest *pcVar1;
  pointer piVar2;
  iterator __position;
  undefined8 uVar3;
  char *__s;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  ostream *poVar7;
  mapped_type *this_00;
  ulong uVar8;
  basic_string_view<char,_std::char_traits<char>_> __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  separateLine;
  string routine;
  string line;
  string filepath;
  ostringstream cmCTestLog_msg;
  ifstream in;
  undefined1 auStack_468 [8];
  cmParseMumpsCoverage *local_460;
  undefined1 local_458 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  pointer local_428;
  string local_420;
  string local_400;
  string local_3e0;
  char *local_3c0;
  undefined1 local_3b8 [16];
  pointer local_3a8;
  ios_base local_348 [272];
  long local_238 [4];
  byte abStack_218 [488];
  
  local_460 = &this->super_cmParseMumpsCoverage;
  std::ifstream::ifstream(local_238,file,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8,"Can not open : ",0xf);
    if (file == (char *)0x0) {
      std::ios::clear((int)auStack_468 + (int)*(_func_int **)(local_3b8._0_8_ + -0x18) + 0xb0);
    }
    else {
      sVar6 = strlen(file);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8,file,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8,"\n",1);
    pcVar1 = local_460->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                 ,0x4d,local_400._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p,
                      CONCAT71(local_400.field_2._M_allocated_capacity._1_7_,
                               local_400.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
    std::ios_base::~ios_base(local_348);
    bVar4 = false;
LAB_001bcca5:
    std::ifstream::~ifstream(local_238);
    return bVar4;
  }
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  local_400._M_string_length = 0;
  local_400.field_2._M_local_buf[0] = '\0';
  bVar4 = cmsys::SystemTools::GetLineFromStream
                    ((istream *)local_238,&local_400,(bool *)0x0,0xffffffffffffffff);
  if (!bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8,"Empty file : ",0xd);
    if (file == (char *)0x0) {
      std::ios::clear((int)auStack_468 + (int)*(_func_int **)(local_3b8._0_8_ + -0x18) + 0xb0);
    }
    else {
      sVar6 = strlen(file);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8,file,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b8,"  referenced in this line of cmcov data:\n[",0x2a);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_3b8,local_400._M_dataplus._M_p,local_400._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]\n",2);
    pcVar1 = local_460->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                 ,0x56,local_420._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,
                      CONCAT71(local_420.field_2._M_allocated_capacity._1_7_,
                               local_420.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
    std::ios_base::~ios_base(local_348);
    bVar4 = false;
LAB_001bcc89:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p,
                      CONCAT71(local_400.field_2._M_allocated_capacity._1_7_,
                               local_400.field_2._M_local_buf[0]) + 1);
    }
    goto LAB_001bcca5;
  }
  cmsys::SystemTools::SplitString
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_438,&local_400,',',false);
  if (local_438._8_8_ - local_438._0_8_ == 0x80) {
    iVar5 = std::__cxx11::string::compare((char *)local_438._M_allocated_capacity);
    if (iVar5 == 0) {
      iVar5 = std::__cxx11::string::compare((char *)(local_438._M_allocated_capacity + 0x20));
      if (iVar5 == 0) {
        iVar5 = std::__cxx11::string::compare((char *)(local_438._M_allocated_capacity + 0x40));
        if (iVar5 == 0) {
          iVar5 = std::__cxx11::string::compare((char *)(local_438._M_allocated_capacity + 0x60));
          if (iVar5 == 0) goto LAB_001bc557;
        }
      }
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3b8,"Bad first line of cmcov file : ",0x1f);
  if (file == (char *)0x0) {
    std::ios::clear((int)auStack_468 + (int)*(_func_int **)(local_3b8._0_8_ + -0x18) + 0xb0);
  }
  else {
    sVar6 = strlen(file);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8,file,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8,"  line:\n[",9);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_3b8,local_400._M_dataplus._M_p,local_400._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]\n",2);
  pcVar1 = local_460->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,7,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
               ,0x62,local_420._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != &local_420.field_2) {
    operator_delete(local_420._M_dataplus._M_p,
                    CONCAT71(local_420.field_2._M_allocated_capacity._1_7_,
                             local_420.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
  std::ios_base::~ios_base(local_348);
LAB_001bc557:
  local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
  local_420._M_string_length = 0;
  local_420.field_2._M_local_buf[0] = '\0';
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  local_3e0._M_string_length = 0;
  local_3e0.field_2._M_local_buf[0] = '\0';
  local_3c0 = file;
LAB_001bc59c:
  bVar4 = cmsys::SystemTools::GetLineFromStream
                    ((istream *)local_238,&local_400,(bool *)0x0,0xffffffffffffffff);
  if (bVar4) {
    cmsys::SystemTools::SplitString
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_458,&local_400,',',false);
    local_3a8 = local_428;
    local_3b8._8_8_ = local_438._8_8_;
    local_3b8._0_8_ = local_438._M_allocated_capacity;
    local_438._M_allocated_capacity = local_458._0_8_;
    local_438._8_8_ = local_458._8_8_;
    local_428 = (pointer)local_458._16_8_;
    local_458._0_8_ = (pointer)0x0;
    local_458._8_8_ = (pointer)0x0;
    local_458._16_8_ = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_3b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_458);
    if (0x7f < (ulong)(local_438._8_8_ - local_438._0_8_)) {
      if (local_420._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&local_420);
        bVar4 = cmParseMumpsCoverage::FindMumpsFile(local_460,&local_420,&local_3e0);
        if (bVar4) goto LAB_001bc6ce;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3b8,"Could not find mumps file for routine: ",0x27);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_3b8,local_420._M_dataplus._M_p,
                            local_420._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        pcVar1 = local_460->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                     ,0x80,(char *)local_458._0_8_,false);
        if ((pointer)local_458._0_8_ != (pointer)(local_458 + 0x10)) {
          operator_delete((void *)local_458._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_458._16_8_)->_M_p + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
        std::ios_base::~ios_base(local_348);
        local_3e0._M_string_length = 0;
        *local_3e0._M_dataplus._M_p = '\0';
      }
      else {
        local_3b8._8_8_ = *(undefined8 *)local_438._M_allocated_capacity;
        local_3b8._0_8_ = *(_func_int **)(local_438._M_allocated_capacity + 8);
        __str._M_str = "Totals";
        __str._M_len = 6;
        iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_3b8,0,6,__str);
        if (iVar5 == 0) {
          local_420._M_string_length = 0;
          *local_420._M_dataplus._M_p = '\0';
          local_3e0._M_string_length = 0;
          *local_3e0._M_dataplus._M_p = '\0';
        }
        else {
LAB_001bc6ce:
          if (local_3e0._M_string_length != 0) {
            this_00 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::operator[](&local_460->Coverage->TotalCoverage,&local_3e0);
            uVar3 = local_438._M_allocated_capacity;
            iVar5 = atoi((char *)*(_func_int **)(local_438._M_allocated_capacity + 0x20));
            uVar8 = (ulong)(iVar5 + -1);
            iVar5 = atoi((char *)*(_func_int **)(uVar3 + 0x40));
            if ((ulong)((long)(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start >> 2) < uVar8) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3b8,
                         "Parse error line is greater than number of lines in file: ",0x3a);
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_3b8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,local_3e0._M_dataplus._M_p,local_3e0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              pcVar1 = local_460->CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar1,7,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                           ,0x9d,(char *)local_458._0_8_,false);
              if ((pointer)local_458._0_8_ != (pointer)(local_458 + 0x10)) {
                operator_delete((void *)local_458._0_8_,
                                (ulong)((long)&((_Alloc_hider *)local_458._16_8_)->_M_p + 1));
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
              std::ios_base::~ios_base(local_348);
            }
            else {
              while( true ) {
                piVar2 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                __position._M_current =
                     (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (uVar8 < (ulong)((long)__position._M_current - (long)piVar2 >> 2)) break;
                local_3b8._0_4_ = 0xffffffff;
                if (__position._M_current ==
                    (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            (this_00,__position,(int *)local_3b8);
                }
                else {
                  *__position._M_current = -1;
                  (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = __position._M_current + 1;
                }
              }
              if ((piVar2[uVar8] == -1) && (0 < iVar5)) {
                piVar2[uVar8] = iVar5;
              }
              else {
                piVar2[uVar8] = piVar2[uVar8] + iVar5;
              }
            }
          }
        }
      }
      goto LAB_001bc59c;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b8,"Bad line of cmcov file expected at least 4 found: ",0x32);
    __s = local_3c0;
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_3b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    if (__s == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
    }
    else {
      sVar6 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,__s,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  line:\n[",9);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_400._M_dataplus._M_p,local_400._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]\n",2);
    pcVar1 = local_460->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                 ,0x71,(char *)local_458._0_8_,false);
    if ((pointer)local_458._0_8_ != (pointer)(local_458 + 0x10)) {
      operator_delete((void *)local_458._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_458._16_8_)->_M_p + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
    std::ios_base::~ios_base(local_348);
    if (local_438._8_8_ != local_438._M_allocated_capacity) {
      uVar8 = 0;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8,"",0);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_3b8,
                            (char *)*(_func_int **)(local_438._M_allocated_capacity + 0x20),
                            (long)*(_func_int **)(local_438._M_allocated_capacity + 0x28));
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        pcVar1 = local_460->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                     ,0x73,(char *)local_458._0_8_,false);
        if ((pointer)local_458._0_8_ != (pointer)(local_458 + 0x10)) {
          operator_delete((void *)local_458._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_458._16_8_)->_M_p + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
        std::ios_base::~ios_base(local_348);
        uVar8 = uVar8 + 1;
      } while (uVar8 < (ulong)((long)(local_438._8_8_ - local_438._0_8_) >> 5));
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8,"\n",1);
    pcVar1 = local_460->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                 ,0x75,(char *)local_458._0_8_,false);
    if ((pointer)local_458._0_8_ != (pointer)(local_458 + 0x10)) {
      operator_delete((void *)local_458._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_458._16_8_)->_M_p + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
    std::ios_base::~ios_base(local_348);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,
                    CONCAT71(local_3e0.field_2._M_allocated_capacity._1_7_,
                             local_3e0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != &local_420.field_2) {
    operator_delete(local_420._M_dataplus._M_p,
                    CONCAT71(local_420.field_2._M_allocated_capacity._1_7_,
                             local_420.field_2._M_local_buf[0]) + 1);
  }
  bVar4 = !bVar4;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_438);
  goto LAB_001bcc89;
}

Assistant:

bool cmParseCacheCoverage::ReadCMCovFile(const char* file)
{
  cmsys::ifstream in(file);
  if (!in) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Can not open : " << file << "\n");
    return false;
  }
  std::string line;
  if (!cmSystemTools::GetLineFromStream(in, line)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Empty file : " << file
                               << "  referenced in this line of cmcov data:\n"
                                  "["
                               << line << "]\n");
    return false;
  }
  std::vector<std::string> separateLine =
    cmSystemTools::SplitString(line, ',');
  if (separateLine.size() != 4 || separateLine[0] != "Routine" ||
      separateLine[1] != "Line" || separateLine[2] != "RtnLine" ||
      separateLine[3] != "Code") {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Bad first line of cmcov file : " << file
                                                 << "  line:\n"
                                                    "["
                                                 << line << "]\n");
  }
  std::string routine;
  std::string filepath;
  while (cmSystemTools::GetLineFromStream(in, line)) {
    // parse the comma separated line
    separateLine = cmSystemTools::SplitString(line, ',');
    // might have more because code could have a quoted , in it
    // but we only care about the first 3 args anyway
    if (separateLine.size() < 4) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Bad line of cmcov file expected at least 4 found: "
                   << separateLine.size() << " " << file
                   << "  line:\n"
                      "["
                   << line << "]\n");
      for (std::string::size_type i = 0; i < separateLine.size(); ++i) {
        cmCTestLog(this->CTest, ERROR_MESSAGE, "" << separateLine[1] << " ");
      }
      cmCTestLog(this->CTest, ERROR_MESSAGE, "\n");
      return false;
    }
    // if we do not have a routine yet, then it should be
    // the first argument in the vector
    if (routine.empty()) {
      routine = separateLine[0];
      // Find the full path to the file
      if (!this->FindMumpsFile(routine, filepath)) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Could not find mumps file for routine: " << routine
                                                             << "\n");
        filepath.clear();
        continue; // move to next line
      }
    }
    // if we have a routine name, check for end of routine
    else {
      // Totals in arg 0 marks the end of a routine
      if (cmHasLiteralPrefix(separateLine[0], "Totals")) {
        routine.clear(); // at the end of this routine
        filepath.clear();
        continue; // move to next line
      }
    }
    // if the file path was not found for the routine
    // move to next line. We should have already warned
    // after the call to FindMumpsFile that we did not find
    // it, so don't report again to cut down on output
    if (filepath.empty()) {
      continue;
    }
    // now we are ready to set the coverage from the line of data
    cmCTestCoverageHandlerContainer::SingleFileCoverageVector& coverageVector =
      this->Coverage.TotalCoverage[filepath];
    std::string::size_type linenumber = atoi(separateLine[1].c_str()) - 1;
    int count = atoi(separateLine[2].c_str());
    if (linenumber > coverageVector.size()) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Parse error line is greater than number of lines in file: "
                   << linenumber << " " << filepath << "\n");
      continue; // skip setting count to avoid crash
    }
    // now add to count for linenumber
    // for some reason the cache coverage adds extra lines to the
    // end of the file in some cases. Since they do not exist, we will
    // mark them as non executable
    while (linenumber >= coverageVector.size()) {
      coverageVector.push_back(-1);
    }
    // Accounts for lines that were previously marked
    // as non-executable code (-1). if the parser comes back with
    // a non-zero count, increase the count by 1 to push the line
    // into the executable code set in addition to the count found.
    if (coverageVector[linenumber] == -1 && count > 0) {
      coverageVector[linenumber] += count + 1;
    } else {
      coverageVector[linenumber] += count;
    }
  }
  return true;
}